

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

int xpath_boolean(lyxp_set **args,uint16_t UNUSED_arg_count,lyd_node *cur_node,lys_module *param_4,
                 lyxp_set *set,int options)

{
  uint uVar1;
  long lVar2;
  
  if ((options & 0x1cU) == 0) {
    lyxp_set_cast(*args,LYXP_SET_BOOLEAN,cur_node,param_4,options);
    set_fill_set(set,*args);
  }
  else {
    uVar1 = set->used;
    if ((ulong)uVar1 != 0) {
      lVar2 = 0;
      do {
        if (*(int *)((long)&((set->val).nodes)->pos + lVar2) == 1) {
          *(undefined4 *)((long)&((set->val).nodes)->pos + lVar2) = 0;
        }
        lVar2 = lVar2 + 0x10;
      } while ((ulong)uVar1 << 4 != lVar2);
    }
  }
  return 0;
}

Assistant:

static int
xpath_boolean(struct lyxp_set **args, uint16_t UNUSED(arg_count), struct lyd_node *cur_node, struct lys_module *local_mod,
              struct lyxp_set *set, int options)
{
    if (options & LYXP_SNODE_ALL) {
        set_snode_clear_ctx(set);
        return EXIT_SUCCESS;
    }

    lyxp_set_cast(args[0], LYXP_SET_BOOLEAN, cur_node, local_mod, options);
    set_fill_set(set, args[0]);

    return EXIT_SUCCESS;
}